

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUIFont * __thiscall
irr::gui::CGUIEnvironment::addFont(CGUIEnvironment *this,path *name,IGUIFont *font)

{
  array<irr::gui::CGUIEnvironment::SFont> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  SFont f;
  SFont local_78;
  
  if (font != (IGUIFont *)0x0) {
    local_78.NamedPath.Path.str._M_dataplus._M_p = (pointer)&local_78.NamedPath.Path.str.field_2;
    local_78.NamedPath.Path.str._M_string_length = 0;
    local_78.NamedPath.Path.str.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_78.NamedPath.InternalName.str.field_2;
    local_78.NamedPath.InternalName.str._M_string_length = 0;
    local_78.NamedPath.InternalName.str.field_2._M_local_buf[0] = '\0';
    local_78.NamedPath.InternalName.str._M_dataplus._M_p = (pointer)paVar1;
    irr::io::SNamedPath::setPath(&local_78.NamedPath,name);
    this_00 = &this->Fonts;
    core::array<irr::gui::CGUIEnvironment::SFont>::sort(this_00);
    uVar2 = core::array<irr::gui::CGUIEnvironment::SFont>::binary_search
                      (this_00,&local_78,0,
                       (int)((ulong)((long)(this->Fonts).m_data.
                                           super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->Fonts).m_data.
                                          super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       0x38e38e39 + -1);
    if (uVar2 == 0xffffffff) {
      local_78.Font = font;
      std::
      vector<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>::
      push_back(&this_00->m_data,&local_78);
      (this->Fonts).is_sorted = false;
      *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) =
           *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) + 1;
    }
    else {
      this = (CGUIEnvironment *)
             (this_00->m_data).
             super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2].Font;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.NamedPath.InternalName.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.NamedPath.InternalName.str._M_dataplus._M_p,
                      CONCAT71(local_78.NamedPath.InternalName.str.field_2._M_allocated_capacity.
                               _1_7_,local_78.NamedPath.InternalName.str.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.NamedPath.Path.str._M_dataplus._M_p != &local_78.NamedPath.Path.str.field_2) {
      operator_delete(local_78.NamedPath.Path.str._M_dataplus._M_p,
                      CONCAT71(local_78.NamedPath.Path.str.field_2._M_allocated_capacity._1_7_,
                               local_78.NamedPath.Path.str.field_2._M_local_buf[0]) + 1);
    }
    if (uVar2 != 0xffffffff) {
      return (IGUIFont *)this;
    }
  }
  return font;
}

Assistant:

IGUIFont *CGUIEnvironment::addFont(const io::path &name, IGUIFont *font)
{
	if (font) {
		SFont f;
		f.NamedPath.setPath(name);
		s32 index = Fonts.binary_search(f);
		if (index != -1)
			return Fonts[index].Font;
		f.Font = font;
		Fonts.push_back(f);
		font->grab();
	}
	return font;
}